

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpPropertiesBinary(Node *this,StreamWriterLE *s)

{
  pointer pFVar1;
  FBXExportProperty *p;
  pointer this_00;
  
  pFVar1 = (this->properties).
           super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->properties).
                 super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1; this_00 = this_00 + 1
      ) {
    FBX::FBXExportProperty::DumpBinary(this_00,s);
  }
  return;
}

Assistant:

void FBX::Node::DumpPropertiesBinary(Assimp::StreamWriterLE& s)
{
    for (auto &p : properties) {
        p.DumpBinary(s);
    }
}